

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xml_node::traverse(xml_node *this,xml_tree_walker *walker)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  xml_node_struct *local_50;
  xml_node local_40;
  xml_node arg_end;
  xml_node arg_for_each;
  xml_node_struct *cur;
  xml_node arg_begin;
  xml_tree_walker *walker_local;
  xml_node *this_local;
  
  walker->_depth = -1;
  arg_begin._root = (xml_node_struct *)walker;
  xml_node((xml_node *)&cur,this->_root);
  uVar2 = (**(code **)((arg_begin._root)->header + 0x10))(arg_begin._root,&cur);
  if ((uVar2 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    if (this->_root == (xml_node_struct *)0x0) {
      local_50 = (xml_node_struct *)0x0;
    }
    else {
      local_50 = this->_root->first_child;
    }
    arg_for_each._root = local_50;
    if (local_50 != (xml_node_struct *)0x0) {
      *(int *)&(arg_begin._root)->name = *(int *)&(arg_begin._root)->name + 1;
      do {
        xml_node(&arg_end,arg_for_each._root);
        uVar2 = (**(code **)((arg_begin._root)->header + 0x18))(arg_begin._root,&arg_end);
        if ((uVar2 & 1) == 0) {
          return false;
        }
        if ((arg_for_each._root)->first_child == (xml_node_struct *)0x0) {
          if ((arg_for_each._root)->next_sibling == (xml_node_struct *)0x0) {
            while( true ) {
              bVar3 = false;
              if (((arg_for_each._root)->next_sibling == (xml_node_struct *)0x0) &&
                 (bVar3 = false, arg_for_each._root != this->_root)) {
                bVar3 = (arg_for_each._root)->parent != (xml_node_struct *)0x0;
              }
              if (!bVar3) break;
              *(int *)&(arg_begin._root)->name = *(int *)&(arg_begin._root)->name + -1;
              arg_for_each._root = (arg_for_each._root)->parent;
            }
            if (arg_for_each._root != this->_root) {
              arg_for_each._root = (arg_for_each._root)->next_sibling;
            }
          }
          else {
            arg_for_each._root = (arg_for_each._root)->next_sibling;
          }
        }
        else {
          *(int *)&(arg_begin._root)->name = *(int *)&(arg_begin._root)->name + 1;
          arg_for_each._root = (arg_for_each._root)->first_child;
        }
        bVar3 = false;
        if (arg_for_each._root != (xml_node_struct *)0x0) {
          bVar3 = arg_for_each._root != this->_root;
        }
      } while (bVar3);
    }
    if (*(int *)&(arg_begin._root)->name != -1) {
      __assert_fail("walker._depth == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                    ,0x1936,"bool pugi::xml_node::traverse(xml_tree_walker &)");
    }
    xml_node(&local_40,this->_root);
    bVar1 = (**(code **)((arg_begin._root)->header + 0x20))(arg_begin._root,&local_40);
    this_local._7_1_ = (bool)(bVar1 & 1);
  }
  return this_local._7_1_;
}

Assistant:

PUGI__FN bool xml_node::traverse(xml_tree_walker& walker)
	{
		walker._depth = -1;

		xml_node arg_begin(_root);
		if (!walker.begin(arg_begin)) return false;

		xml_node_struct* cur = _root ? _root->first_child + 0 : 0;

		if (cur)
		{
			++walker._depth;

			do
			{
				xml_node arg_for_each(cur);
				if (!walker.for_each(arg_for_each))
					return false;

				if (cur->first_child)
				{
					++walker._depth;
					cur = cur->first_child;
				}
				else if (cur->next_sibling)
					cur = cur->next_sibling;
				else
				{
					while (!cur->next_sibling && cur != _root && cur->parent)
					{
						--walker._depth;
						cur = cur->parent;
					}

					if (cur != _root)
						cur = cur->next_sibling;
				}
			}
			while (cur && cur != _root);
		}

		assert(walker._depth == -1);

		xml_node arg_end(_root);
		return walker.end(arg_end);
	}